

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

void directories::MADPCreateResultsDir(string *method,string *problem)

{
  int iVar1;
  ostream *poVar2;
  E *this;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  stat statInfo;
  stringstream ss;
  ostream local_190 [376];
  
  MADPGetResultsDir_abi_cxx11_();
  std::operator+(&local_270,&local_250,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&statInfo,
                 &local_270,method);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&statInfo,"/")
  ;
  std::operator+(&dir,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 problem);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&statInfo);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  iVar1 = stat(dir._M_dataplus._M_p,(stat *)&statInfo);
  if ((iVar1 != 0) || ((statInfo.st_mode & 0xf000) != 0x4000)) {
    iVar1 = mkdir(dir._M_dataplus._M_p,0x1ff);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(local_190,"mkdir error for ");
      std::operator<<(poVar2,(string *)&dir);
      this = (E *)__cxa_allocate_exception(0x28);
      E::E(this,&ss);
      __cxa_throw(this,&E::typeinfo,E::~E);
    }
  }
  std::__cxx11::string::~string((string *)&dir);
  return;
}

Assistant:

void directories::MADPCreateResultsDir(const string & method,
                                       const string & problem)
{
    string dir=MADPGetResultsDir() + "/" + method + "/" + problem;
    
    struct stat statInfo;
    if(stat(dir.c_str(),&statInfo)==0 &&
       S_ISDIR(statInfo.st_mode))
    {
#if 0
        cout << "Results dir " << dir << " already exists" << endl;
#endif
    }
    else
        if(mkdir(dir.c_str(),0777)!=0)
        {
            stringstream ss;
            ss << "mkdir error for " << dir;
            throw(E(ss));
        }
}